

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::QueryServiceState
          (ConsumerEndpointImpl *this,QueryServiceStateCallback *callback)

{
  bool bVar1;
  uid_t value;
  pid_t value_00;
  uint32_t uVar2;
  char *__s;
  size_type sVar3;
  reference ppVar4;
  map<unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*>_>_>
  *this_00;
  reference ppVar5;
  TracingServiceState_Producer *this_01;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>_>
  *this_02;
  reference ppVar6;
  TracingServiceState_DataSource *this_03;
  DataSourceDescriptor *this_04;
  map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
  *pmVar7;
  reference ppVar8;
  TracingServiceState_TracingSession *this_05;
  size_type sVar9;
  string *value_01;
  ClockSnapshotData *this_06;
  reference ppVar10;
  vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
  *this_07;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  reference local_1e8;
  TraceConfig_BufferConfig *buf;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
  *__range2_1;
  pair<unsigned_int,_unsigned_long> *snap_kv;
  const_iterator __end2;
  const_iterator __begin2;
  ClockSnapshotData *__range2;
  TracingServiceState_TracingSession *session;
  TracingSession *s;
  pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession> *kv_3;
  iterator __end1_3;
  iterator __begin1_3;
  map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
  *__range1_3;
  TracingServiceState_DataSource *data_source;
  RegisteredDataSource *registered_data_source;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>
  *kv_2;
  iterator __end1_2;
  iterator __begin1_2;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>_>
  *__range1_2;
  TracingServiceState_Producer *producer;
  pair<const_unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*> *kv_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*>_>_>
  *__range1_1;
  pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession> *kv;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
  *__range1;
  allocator<char> local_f5;
  int num_started;
  string local_e8;
  map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
  *local_c8;
  map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
  *sessions;
  TracingServiceState svc_state;
  QueryServiceStateCallback *callback_local;
  ConsumerEndpointImpl *this_local;
  
  svc_state._has_field_.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)(_Base_bitset<1UL>)callback;
  protos::gen::TracingServiceState::TracingServiceState((TracingServiceState *)&sessions);
  local_c8 = &this->service_->tracing_sessions_;
  __s = perfetto::base::GetVersionString();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,__s,&local_f5);
  protos::gen::TracingServiceState::set_tracing_service_version
            ((TracingServiceState *)&sessions,&local_e8);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::allocator<char>::~allocator(&local_f5);
  sVar3 = std::
          map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
          ::size(local_c8);
  protos::gen::TracingServiceState::set_num_sessions
            ((TracingServiceState *)&sessions,(int32_t)sVar3);
  pmVar7 = local_c8;
  __range1._4_4_ = 0;
  __end1 = std::
           map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
           ::begin(local_c8);
  kv = (pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession> *)
       std::
       map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
       ::end(pmVar7);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&kv), bVar1) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>
             ::operator*(&__end1);
    __range1._4_4_ = (uint)((ppVar4->second).state == STARTED) + __range1._4_4_;
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>
    ::operator++(&__end1);
  }
  protos::gen::TracingServiceState::set_num_sessions_started
            ((TracingServiceState *)&sessions,__range1._4_4_);
  this_00 = &this->service_->producers_;
  __end1_1 = std::
             map<unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*>_>_>
             ::begin(this_00);
  kv_1 = (pair<const_unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*> *)
         std::
         map<unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*>_>_>
         ::end(this_00);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&kv_1), bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*>_>
             ::operator*(&__end1_1);
    this_01 = protos::gen::TracingServiceState::add_producers((TracingServiceState *)&sessions);
    protos::gen::TracingServiceState_Producer::set_id(this_01,(uint)ppVar5->first);
    protos::gen::TracingServiceState_Producer::set_name(this_01,&ppVar5->second->name_);
    protos::gen::TracingServiceState_Producer::set_sdk_version
              (this_01,&ppVar5->second->sdk_version_);
    value = ProducerEndpointImpl::uid(ppVar5->second);
    protos::gen::TracingServiceState_Producer::set_uid(this_01,value);
    value_00 = ProducerEndpointImpl::pid(ppVar5->second);
    protos::gen::TracingServiceState_Producer::set_pid(this_01,value_00);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::ProducerEndpointImpl_*>_>
    ::operator++(&__end1_1);
  }
  this_02 = &this->service_->data_sources_;
  __end1_2 = std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>_>
             ::begin(this_02);
  kv_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>
          *)std::
            multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>_>
            ::end(this_02);
  while (bVar1 = std::operator!=(&__end1_2,(_Self *)&kv_2), bVar1) {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>
             ::operator*(&__end1_2);
    this_03 = protos::gen::TracingServiceState::add_data_sources((TracingServiceState *)&sessions);
    this_04 = protos::gen::TracingServiceState_DataSource::mutable_ds_descriptor(this_03);
    protos::gen::DataSourceDescriptor::operator=(this_04,&(ppVar6->second).descriptor);
    protos::gen::TracingServiceState_DataSource::set_producer_id
              (this_03,(uint)(ppVar6->second).producer_id);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>
    ::operator++(&__end1_2);
  }
  protos::gen::TracingServiceState::set_supports_tracing_sessions
            ((TracingServiceState *)&sessions,true);
  pmVar7 = &this->service_->tracing_sessions_;
  __end1_3 = std::
             map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
             ::begin(pmVar7);
  kv_3 = (pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession> *)
         std::
         map<unsigned_long,_perfetto::TracingServiceImpl::TracingSession,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>_>
         ::end(pmVar7);
  while (bVar1 = std::operator!=(&__end1_3,(_Self *)&kv_3), bVar1) {
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>
             ::operator*(&__end1_3);
    if ((this->uid_ == 0) || (this->uid_ == (ppVar8->second).consumer_uid)) {
      this_05 = protos::gen::TracingServiceState::add_tracing_sessions
                          ((TracingServiceState *)&sessions);
      protos::gen::TracingServiceState_TracingSession::set_id(this_05,(ppVar8->second).id);
      protos::gen::TracingServiceState_TracingSession::set_consumer_uid
                (this_05,(ppVar8->second).consumer_uid);
      uVar2 = protos::gen::TraceConfig::duration_ms(&(ppVar8->second).config);
      protos::gen::TracingServiceState_TracingSession::set_duration_ms(this_05,uVar2);
      sVar9 = std::
              multimap<unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance>_>_>
              ::size(&(ppVar8->second).data_source_instances);
      protos::gen::TracingServiceState_TracingSession::set_num_data_sources(this_05,(uint32_t)sVar9)
      ;
      value_01 = protos::gen::TraceConfig::unique_session_name_abi_cxx11_(&(ppVar8->second).config);
      protos::gen::TracingServiceState_TracingSession::set_unique_session_name(this_05,value_01);
      this_06 = &(ppVar8->second).initial_clock_snapshot;
      __end2 = std::
               vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
               ::begin(this_06);
      snap_kv = (pair<unsigned_int,_unsigned_long> *)
                std::
                vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                ::end(this_06);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                                         *)&snap_kv), bVar1) {
        ppVar10 = __gnu_cxx::
                  __normal_iterator<const_std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                  ::operator*(&__end2);
        if (ppVar10->first == 1) {
          protos::gen::TracingServiceState_TracingSession::set_start_realtime_ns
                    (this_05,ppVar10->second);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
        ::operator++(&__end2);
      }
      this_07 = protos::gen::TraceConfig::buffers(&(ppVar8->second).config);
      __end2_1 = std::
                 vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
                 ::begin(this_07);
      buf = (TraceConfig_BufferConfig *)
            std::
            vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
            ::end(this_07);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_perfetto::protos::gen::TraceConfig_BufferConfig_*,_std::vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>_>
                                 *)&buf), bVar1) {
        local_1e8 = __gnu_cxx::
                    __normal_iterator<const_perfetto::protos::gen::TraceConfig_BufferConfig_*,_std::vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>_>
                    ::operator*(&__end2_1);
        uVar2 = protos::gen::TraceConfig_BufferConfig::size_kb(local_1e8);
        protos::gen::TracingServiceState_TracingSession::add_buffer_size_kb(this_05,uVar2);
        __gnu_cxx::
        __normal_iterator<const_perfetto::protos::gen::TraceConfig_BufferConfig_*,_std::vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>_>
        ::operator++(&__end2_1);
      }
      switch((ppVar8->second).state) {
      case DISABLED:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"DISABLED",&local_209);
        protos::gen::TracingServiceState_TracingSession::set_state(this_05,&local_208);
        ::std::__cxx11::string::~string((string *)&local_208);
        ::std::allocator<char>::~allocator(&local_209);
        break;
      case CONFIGURED:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"CONFIGURED",&local_231);
        protos::gen::TracingServiceState_TracingSession::set_state(this_05,&local_230);
        ::std::__cxx11::string::~string((string *)&local_230);
        ::std::allocator<char>::~allocator(&local_231);
        break;
      case STARTED:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"STARTED",&local_259);
        protos::gen::TracingServiceState_TracingSession::set_state(this_05,&local_258);
        ::std::__cxx11::string::~string((string *)&local_258);
        ::std::allocator<char>::~allocator(&local_259);
        break;
      case DISABLING_WAITING_STOP_ACKS:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,"STOP_WAIT",&local_281);
        protos::gen::TracingServiceState_TracingSession::set_state(this_05,&local_280);
        ::std::__cxx11::string::~string((string *)&local_280);
        ::std::allocator<char>::~allocator(&local_281);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::TracingSession>_>
    ::operator++(&__end1_3);
  }
  std::function<void_(bool,_const_perfetto::protos::gen::TracingServiceState_&)>::operator()
            (callback,true,(TracingServiceState *)&sessions);
  protos::gen::TracingServiceState::~TracingServiceState((TracingServiceState *)&sessions);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::QueryServiceState(
    QueryServiceStateCallback callback) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  TracingServiceState svc_state;

  const auto& sessions = service_->tracing_sessions_;
  svc_state.set_tracing_service_version(base::GetVersionString());
  svc_state.set_num_sessions(static_cast<int>(sessions.size()));

  int num_started = 0;
  for (const auto& kv : sessions)
    num_started += kv.second.state == TracingSession::State::STARTED ? 1 : 0;
  svc_state.set_num_sessions_started(static_cast<int>(num_started));

  for (const auto& kv : service_->producers_) {
    auto* producer = svc_state.add_producers();
    producer->set_id(static_cast<int>(kv.first));
    producer->set_name(kv.second->name_);
    producer->set_sdk_version(kv.second->sdk_version_);
    producer->set_uid(static_cast<int32_t>(kv.second->uid()));
    producer->set_pid(static_cast<int32_t>(kv.second->pid()));
  }

  for (const auto& kv : service_->data_sources_) {
    const auto& registered_data_source = kv.second;
    auto* data_source = svc_state.add_data_sources();
    *data_source->mutable_ds_descriptor() = registered_data_source.descriptor;
    data_source->set_producer_id(
        static_cast<int>(registered_data_source.producer_id));
  }

  svc_state.set_supports_tracing_sessions(true);
  for (const auto& kv : service_->tracing_sessions_) {
    const TracingSession& s = kv.second;
    // List only tracing sessions for the calling UID (or everything for root).
    if (uid_ != 0 && uid_ != s.consumer_uid)
      continue;
    auto* session = svc_state.add_tracing_sessions();
    session->set_id(s.id);
    session->set_consumer_uid(static_cast<int>(s.consumer_uid));
    session->set_duration_ms(s.config.duration_ms());
    session->set_num_data_sources(
        static_cast<uint32_t>(s.data_source_instances.size()));
    session->set_unique_session_name(s.config.unique_session_name());
    for (const auto& snap_kv : s.initial_clock_snapshot) {
      if (snap_kv.first == protos::pbzero::BUILTIN_CLOCK_REALTIME)
        session->set_start_realtime_ns(static_cast<int64_t>(snap_kv.second));
    }
    for (const auto& buf : s.config.buffers())
      session->add_buffer_size_kb(buf.size_kb());

    switch (s.state) {
      case TracingSession::State::DISABLED:
        session->set_state("DISABLED");
        break;
      case TracingSession::State::CONFIGURED:
        session->set_state("CONFIGURED");
        break;
      case TracingSession::State::STARTED:
        session->set_state("STARTED");
        break;
      case TracingSession::State::DISABLING_WAITING_STOP_ACKS:
        session->set_state("STOP_WAIT");
        break;
    }
  }
  callback(/*success=*/true, svc_state);
}